

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O1

int gf256_init_(int version)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  uint8_t *puVar10;
  int iVar11;
  byte bVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  
  iVar11 = -1;
  if ((version == 2) && (iVar11 = 0, Initialized == '\0')) {
    Initialized = '\x01';
    lVar13 = 0;
    lVar7 = cpuid_Version_info(1);
    CpuHasSSSE3 = (bool)((byte)(*(uint *)(lVar7 + 0xc) >> 9) & 1);
    lVar7 = cpuid_Extended_Feature_Enumeration_info(7);
    bVar12 = (byte)*(undefined4 *)(lVar7 + 4) >> 5;
    CpuHasAVX2 = (bool)(bVar12 & 1);
    GF256Ctx.Polynomial = 0x14d;
    GF256Ctx.GF256_LOG_TABLE[0] = 0x200;
    GF256Ctx.GF256_EXP_TABLE[0] = '\x01';
    do {
      bVar8 = 0;
      if ((char)GF256Ctx.GF256_EXP_TABLE[lVar13] < '\0') {
        bVar8 = 0x4d;
      }
      bVar8 = bVar8 ^ GF256Ctx.GF256_EXP_TABLE[lVar13] * '\x02';
      GF256Ctx.GF256_EXP_TABLE[lVar13 + 1] = bVar8;
      lVar13 = lVar13 + 1;
      GF256Ctx.GF256_LOG_TABLE[bVar8] = (uint16_t)lVar13;
    } while (lVar13 != 0xfe);
    GF256Ctx.GF256_EXP_TABLE[0xff] = '\x01';
    GF256Ctx.GF256_LOG_TABLE[1] = 0xff;
    uVar9 = 0x100;
    lVar7 = 0;
    do {
      GF256Ctx.GF256_EXP_TABLE[lVar7 + 0x100] =
           (GF256Ctx.GF256_EXP_TABLE + lVar7 + 0x100)[(uVar9 / 0xff) * -0xff];
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xfe);
    GF256Ctx.GF256_EXP_TABLE[0x1fe] = '\x01';
    GF256Ctx.GF256_EXP_TABLE[0x1ff] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x200] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x201] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x202] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x203] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x204] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x205] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x206] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x207] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x208] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x209] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x20a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x20b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x20c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x20d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x20e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x20f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x210] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x211] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x212] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x213] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x214] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x215] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x216] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x217] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x218] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x219] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x21a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x21b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x21c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x21d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x21e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x21f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x220] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x221] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x222] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x223] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x224] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x225] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x226] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x227] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x228] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x229] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x22a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x22b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x22c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x22d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x22e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x22f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x230] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x231] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x232] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x233] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x234] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x235] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x236] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x237] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x238] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x239] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x23a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x23b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x23c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x23d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x23e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x23f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x240] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x241] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x242] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x243] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x244] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x245] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x246] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x247] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x248] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x249] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x24a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x24b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x24c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x24d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x24e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x24f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x250] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x251] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x252] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x253] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x254] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x255] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x256] = '\0';
    GF256Ctx.GF256_EXP_TABLE[599] = '\0';
    GF256Ctx.GF256_EXP_TABLE[600] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x259] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x25a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x25b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x25c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x25d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x25e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x25f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x260] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x261] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x262] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x263] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x264] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x265] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x266] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x267] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x268] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x269] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x26a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x26b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x26c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x26d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x26e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x26f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x270] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x271] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x272] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x273] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x274] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x275] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x276] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x277] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x278] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x279] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x27a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x27b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x27c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x27d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x27e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x27f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x280] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x281] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x282] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x283] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x284] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x285] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x286] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x287] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x288] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x289] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x28a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x28b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x28c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x28d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x28e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x28f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x290] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x291] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x292] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x293] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x294] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x295] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x296] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x297] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x298] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x299] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x29a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x29b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x29c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x29d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x29e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x29f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2a0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2a1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2a2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2a3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2a4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2a5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2a6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2a7] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2a8] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2a9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2aa] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ab] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ac] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ad] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ae] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2af] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2b0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2b1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2b2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2b3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2b4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2b5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2b6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2b7] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2b8] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2b9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ba] = '\0';
    GF256Ctx.GF256_EXP_TABLE[699] = '\0';
    GF256Ctx.GF256_EXP_TABLE[700] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2bd] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2be] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2bf] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2c0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2c1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2c2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2c3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2c4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2c5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2c6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2c7] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2c8] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2c9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ca] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2cb] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2cc] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2cd] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ce] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2cf] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2d0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2d1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2d2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2d3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2d4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2d5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2d6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2d7] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2d8] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2d9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2da] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2db] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2dc] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2dd] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2de] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2df] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2e0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2e1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2e2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2e3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2e4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2e5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2e6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2e7] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2e8] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2e9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ea] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2eb] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ec] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ed] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ee] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ef] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2f0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2f1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2f2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2f3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2f4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2f5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2f6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2f7] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2f8] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2f9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2fa] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2fb] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2fc] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2fd] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2fe] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x2ff] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x300] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x301] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x302] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x303] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x304] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x305] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x306] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x307] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x308] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x309] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x30a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x30b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x30c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x30d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x30e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x30f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x310] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x311] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x312] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x313] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x314] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x315] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x316] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x317] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x318] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x319] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x31a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x31b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x31c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x31d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x31e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[799] = '\0';
    GF256Ctx.GF256_EXP_TABLE[800] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x321] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x322] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x323] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x324] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x325] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x326] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x327] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x328] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x329] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x32a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x32b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x32c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x32d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x32e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x32f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x330] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x331] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x332] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x333] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x334] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x335] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x336] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x337] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x338] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x339] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x33a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x33b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x33c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x33d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x33e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x33f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x340] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x341] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x342] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x343] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x344] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x345] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x346] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x347] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x348] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x349] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x34a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x34b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x34c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x34d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x34e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x34f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x350] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x351] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x352] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x353] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x354] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x355] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x356] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x357] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x358] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x359] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x35a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x35b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x35c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x35d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x35e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x35f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x360] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x361] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x362] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x363] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x364] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x365] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x366] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x367] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x368] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x369] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x36a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x36b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x36c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x36d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x36e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x36f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x370] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x371] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x372] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x373] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x374] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x375] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x376] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x377] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x378] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x379] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x37a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x37b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x37c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x37d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x37e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x37f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x380] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x381] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x382] = '\0';
    GF256Ctx.GF256_EXP_TABLE[899] = '\0';
    GF256Ctx.GF256_EXP_TABLE[900] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x385] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x386] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x387] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x388] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x389] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x38a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x38b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x38c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x38d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x38e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x38f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x390] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x391] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x392] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x393] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x394] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x395] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x396] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x397] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x398] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x399] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x39a] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x39b] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x39c] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x39d] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x39e] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x39f] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3a0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3a1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3a2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3a3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3a4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3a5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3a6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3a7] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3a8] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3a9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3aa] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ab] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ac] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ad] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ae] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3af] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3b0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3b1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3b2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3b3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3b4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3b5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3b6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3b7] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3b8] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3b9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ba] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3bb] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3bc] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3bd] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3be] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3bf] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3c0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3c1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3c2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3c3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3c4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3c5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3c6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3c7] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3c8] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3c9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ca] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3cb] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3cc] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3cd] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ce] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3cf] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3d0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3d1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3d2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3d3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3d4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3d5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3d6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3d7] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3d8] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3d9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3da] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3db] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3dc] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3dd] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3de] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3df] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3e0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3e1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3e2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3e3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3e4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3e5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3e6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[999] = '\0';
    GF256Ctx.GF256_EXP_TABLE[1000] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3e9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ea] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3eb] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ec] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ed] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ee] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3ef] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3f0] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3f1] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3f2] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3f3] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3f4] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3f5] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3f6] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3f7] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3f8] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3f9] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3fa] = '\0';
    GF256Ctx.GF256_EXP_TABLE[0x3fb] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0] = '\0';
    GF256Ctx.GF256_MUL_TABLE[1] = '\0';
    GF256Ctx.GF256_MUL_TABLE[2] = '\0';
    GF256Ctx.GF256_MUL_TABLE[3] = '\0';
    GF256Ctx.GF256_MUL_TABLE[4] = '\0';
    GF256Ctx.GF256_MUL_TABLE[5] = '\0';
    GF256Ctx.GF256_MUL_TABLE[6] = '\0';
    GF256Ctx.GF256_MUL_TABLE[7] = '\0';
    GF256Ctx.GF256_MUL_TABLE[8] = '\0';
    GF256Ctx.GF256_MUL_TABLE[9] = '\0';
    GF256Ctx.GF256_MUL_TABLE[10] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xb] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xc] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xd] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xe] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xf] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x10] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x11] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x12] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x13] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x14] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x15] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x16] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x17] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x18] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x19] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x1a] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x1b] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x1c] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x1d] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x1e] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x1f] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x20] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x21] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x22] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x23] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x24] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x25] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x26] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x27] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x28] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x29] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x2a] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x2b] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x2c] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x2d] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x2e] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x2f] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x30] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x31] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x32] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x33] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x34] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x35] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x36] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x37] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x38] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x39] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x3a] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x3b] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x3c] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x3d] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x3e] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x3f] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x40] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x41] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x42] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x43] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x44] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x45] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x46] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x47] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x48] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x49] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x4a] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x4b] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x4c] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x4d] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x4e] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x4f] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x50] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x51] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x52] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x53] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x54] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x55] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x56] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x57] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x58] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x59] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x5a] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x5b] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x5c] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x5d] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x5e] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x5f] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x60] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x61] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x62] = '\0';
    GF256Ctx.GF256_MUL_TABLE[99] = '\0';
    GF256Ctx.GF256_MUL_TABLE[100] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x65] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x66] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x67] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x68] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x69] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x6a] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x6b] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x6c] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x6d] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x6e] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x6f] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x70] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x71] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x72] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x73] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x74] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x75] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x76] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x77] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x78] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x79] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x7a] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x7b] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x7c] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x7d] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x7e] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x7f] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x80] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x81] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x82] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x83] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x84] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x85] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x86] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x87] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x88] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x89] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x8a] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x8b] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x8c] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x8d] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x8e] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x8f] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x90] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x91] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x92] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x93] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x94] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x95] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x96] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x97] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x98] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x99] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x9a] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x9b] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x9c] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x9d] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x9e] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0x9f] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xa0] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xa1] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xa2] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xa3] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xa4] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xa5] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xa6] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xa7] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xa8] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xa9] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xaa] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xab] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xac] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xad] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xae] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xaf] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xb0] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xb1] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xb2] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xb3] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xb4] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xb5] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xb6] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xb7] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xb8] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xb9] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xba] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xbb] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xbc] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xbd] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xbe] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xbf] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xc0] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xc1] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xc2] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xc3] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xc4] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xc5] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xc6] = '\0';
    GF256Ctx.GF256_MUL_TABLE[199] = '\0';
    GF256Ctx.GF256_MUL_TABLE[200] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xc9] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xca] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xcb] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xcc] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xcd] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xce] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xcf] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xd0] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xd1] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xd2] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xd3] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xd4] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xd5] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xd6] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xd7] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xd8] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xd9] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xda] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xdb] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xdc] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xdd] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xde] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xdf] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xe0] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xe1] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xe2] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xe3] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xe4] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xe5] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xe6] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xe7] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xe8] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xe9] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xea] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xeb] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xec] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xed] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xee] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xef] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xf0] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xf1] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xf2] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xf3] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xf4] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xf5] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xf6] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xf7] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xf8] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xf9] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xfa] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xfb] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xfc] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xfd] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xfe] = '\0';
    GF256Ctx.GF256_MUL_TABLE[0xff] = '\0';
    lVar7 = 0x124320;
    GF256Ctx.GF256_DIV_TABLE[0] = '\0';
    GF256Ctx.GF256_DIV_TABLE[1] = '\0';
    GF256Ctx.GF256_DIV_TABLE[2] = '\0';
    GF256Ctx.GF256_DIV_TABLE[3] = '\0';
    GF256Ctx.GF256_DIV_TABLE[4] = '\0';
    GF256Ctx.GF256_DIV_TABLE[5] = '\0';
    GF256Ctx.GF256_DIV_TABLE[6] = '\0';
    GF256Ctx.GF256_DIV_TABLE[7] = '\0';
    GF256Ctx.GF256_DIV_TABLE[8] = '\0';
    GF256Ctx.GF256_DIV_TABLE[9] = '\0';
    GF256Ctx.GF256_DIV_TABLE[10] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xb] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xc] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xd] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xe] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xf] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x10] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x11] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x12] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x13] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x14] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x15] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x16] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x17] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x18] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x19] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x1a] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x1b] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x1c] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x1d] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x1e] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x1f] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x20] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x21] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x22] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x23] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x24] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x25] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x26] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x27] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x28] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x29] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x2a] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x2b] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x2c] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x2d] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x2e] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x2f] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x30] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x31] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x32] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x33] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x34] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x35] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x36] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x37] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x38] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x39] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x3a] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x3b] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x3c] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x3d] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x3e] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x3f] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x40] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x41] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x42] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x43] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x44] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x45] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x46] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x47] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x48] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x49] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x4a] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x4b] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x4c] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x4d] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x4e] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x4f] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x50] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x51] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x52] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x53] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x54] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x55] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x56] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x57] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x58] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x59] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x5a] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x5b] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x5c] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x5d] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x5e] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x5f] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x60] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x61] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x62] = '\0';
    GF256Ctx.GF256_DIV_TABLE[99] = '\0';
    GF256Ctx.GF256_DIV_TABLE[100] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x65] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x66] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x67] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x68] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x69] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x6a] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x6b] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x6c] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x6d] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x6e] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x6f] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x70] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x71] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x72] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x73] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x74] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x75] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x76] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x77] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x78] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x79] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x7a] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x7b] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x7c] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x7d] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x7e] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x7f] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x80] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x81] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x82] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x83] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x84] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x85] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x86] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x87] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x88] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x89] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x8a] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x8b] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x8c] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x8d] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x8e] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x8f] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x90] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x91] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x92] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x93] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x94] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x95] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x96] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x97] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x98] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x99] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x9a] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x9b] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x9c] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x9d] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x9e] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0x9f] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xa0] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xa1] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xa2] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xa3] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xa4] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xa5] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xa6] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xa7] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xa8] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xa9] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xaa] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xab] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xac] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xad] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xae] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xaf] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xb0] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xb1] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xb2] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xb3] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xb4] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xb5] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xb6] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xb7] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xb8] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xb9] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xba] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xbb] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xbc] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xbd] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xbe] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xbf] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xc0] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xc1] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xc2] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xc3] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xc4] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xc5] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xc6] = '\0';
    GF256Ctx.GF256_DIV_TABLE[199] = '\0';
    GF256Ctx.GF256_DIV_TABLE[200] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xc9] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xca] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xcb] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xcc] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xcd] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xce] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xcf] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xd0] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xd1] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xd2] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xd3] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xd4] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xd5] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xd6] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xd7] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xd8] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xd9] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xda] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xdb] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xdc] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xdd] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xde] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xdf] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xe0] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xe1] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xe2] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xe3] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xe4] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xe5] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xe6] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xe7] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xe8] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xe9] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xea] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xeb] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xec] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xed] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xee] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xef] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xf0] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xf1] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xf2] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xf3] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xf4] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xf5] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xf6] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xf7] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xf8] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xf9] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xfa] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xfb] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xfc] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xfd] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xfe] = '\0';
    GF256Ctx.GF256_DIV_TABLE[0xff] = '\0';
    lVar13 = 0x134320;
    lVar14 = 1;
    lVar15 = 0x134421;
    do {
      bVar8 = (byte)GF256Ctx.GF256_LOG_TABLE[lVar14];
      *(undefined1 *)(lVar7 + 0x100) = 0;
      lVar7 = lVar7 + 0x100;
      *(undefined1 *)(lVar13 + 0x100) = 0;
      lVar13 = lVar13 + 0x100;
      lVar18 = 0;
      do {
        uVar1 = GF256Ctx.GF256_LOG_TABLE[lVar18 + 1];
        *(uint8_t *)(lVar15 + -0x10000 + lVar18) =
             GF256Ctx.GF256_EXP_TABLE[(ulong)uVar1 + (ulong)bVar8];
        *(uint8_t *)(lVar15 + lVar18) =
             GF256Ctx.GF256_EXP_TABLE[(ulong)uVar1 + (ulong)(bVar8 ^ 0xff)];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0xff);
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0x100;
    } while (lVar14 != 0x100);
    lVar7 = -0x10000;
    puVar10 = GF256Ctx.GF256_INV_TABLE;
    do {
      *puVar10 = GF256Ctx.GF256_INV_TABLE[lVar7 + 1];
      puVar10 = puVar10 + 1;
      lVar7 = lVar7 + 0x100;
    } while (lVar7 != 0);
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    lVar7 = 0;
    auVar34 = vpbroadcastq_avx512f(ZEXT816(0x40));
    do {
      auVar35 = vpsllq_avx512f(auVar26,8);
      auVar35 = vpaddq_avx512f(auVar35,auVar26);
      auVar36 = vpsllq_avx512f(auVar27,8);
      auVar36 = vpaddq_avx512f(auVar36,auVar27);
      auVar37 = vpsllq_avx512f(auVar30,8);
      auVar37 = vpaddq_avx512f(auVar37,auVar30);
      auVar38 = vpsllq_avx512f(auVar31,8);
      auVar39 = vpsllq_avx512f(auVar32,8);
      auVar40 = vpsllq_avx512f(auVar33,8);
      auVar38 = vpaddq_avx512f(auVar38,auVar31);
      auVar40 = vpaddq_avx512f(auVar40,auVar33);
      lVar13 = vpextrq_avx(auVar38._0_16_,1);
      auVar21 = vextracti32x4_avx512vl(auVar38._0_32_,1);
      auVar2 = vpinsrb_avx(ZEXT416(*(uint *)(GF256Ctx.GF256_MUL_TABLE + auVar38._0_8_)),
                           (uint)GF256Ctx.GF256_MUL_TABLE[lVar13],1);
      auVar22 = vextracti32x4_avx512f(auVar38,2);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar21._0_8_],2);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar21._8_8_],3);
      auVar21 = vextracti32x4_avx512f(auVar38,3);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar22._0_8_],4);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar22._8_8_],5);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar21._0_8_],6);
      lVar13 = vpextrq_avx(auVar21,1);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],7);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar37._0_8_],8);
      lVar13 = vpextrq_avx(auVar37._0_16_,1);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],9);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar37._16_8_],10);
      lVar13 = vpextrq_avx(auVar37._16_16_,1);
      auVar21 = vextracti32x4_avx512f(auVar37,2);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],0xb);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar21._0_8_],0xc);
      lVar13 = vpextrq_avx(auVar21,1);
      auVar22 = vextracti32x4_avx512f(auVar37,3);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],0xd);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar22._0_8_],0xe);
      lVar13 = vpextrq_avx(auVar40._0_16_,1);
      auVar23 = vextracti32x4_avx512vl(auVar40._0_32_,1);
      auVar21 = vpinsrb_avx(ZEXT416(*(uint *)(GF256Ctx.GF256_MUL_TABLE + auVar40._0_8_)),
                            (uint)GF256Ctx.GF256_MUL_TABLE[lVar13],1);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[auVar23._0_8_],2);
      auVar24 = vextracti32x4_avx512f(auVar40,2);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[auVar23._8_8_],3);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[auVar24._0_8_],4);
      auVar23 = vextracti32x4_avx512f(auVar40,3);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[auVar24._8_8_],5);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[auVar23._0_8_],6);
      lVar13 = vpextrq_avx(auVar23,1);
      auVar37 = vpaddq_avx512f(auVar39,auVar32);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],7);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[auVar37._0_8_],8);
      lVar13 = vpextrq_avx(auVar37._0_16_,1);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],9);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[auVar37._16_8_],10);
      lVar13 = vpextrq_avx(auVar37._16_16_,1);
      auVar23 = vextracti32x4_avx512f(auVar37,2);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],0xb);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[auVar23._0_8_],0xc);
      lVar13 = vpextrq_avx(auVar23,1);
      auVar38 = vpsllq_avx512f(auVar29,8);
      auVar23 = vextracti32x4_avx512f(auVar37,3);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],0xd);
      lVar13 = vpextrq_avx(auVar22,1);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],0xf);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[auVar23._0_8_],0xe);
      lVar13 = vpextrq_avx(auVar36._0_16_,1);
      auVar22 = vpinsrb_avx(ZEXT416(*(uint *)(GF256Ctx.GF256_MUL_TABLE + auVar36._0_8_)),
                            (uint)GF256Ctx.GF256_MUL_TABLE[lVar13],1);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[auVar36._16_8_],2);
      lVar13 = vpextrq_avx(auVar36._16_16_,1);
      auVar24 = vextracti32x4_avx512f(auVar36,2);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],3);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[auVar24._0_8_],4);
      lVar13 = vpextrq_avx(auVar24,1);
      auVar37 = vpaddq_avx512f(auVar38,auVar29);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],5);
      auVar24 = vextracti32x4_avx512f(auVar36,3);
      auVar21 = vpinsrb_avx(auVar21,(uint)GF256Ctx.GF256_MUL_TABLE[auVar23._8_8_],0xf);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[auVar24._0_8_],6);
      lVar13 = vpextrq_avx(auVar24,1);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],7);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[auVar35._0_8_],8);
      lVar13 = vpextrq_avx(auVar35._0_16_,1);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],9);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[auVar35._16_8_],10);
      lVar13 = vpextrq_avx(auVar35._16_16_,1);
      auVar23 = vextracti32x4_avx512f(auVar35,2);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],0xb);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[auVar23._0_8_],0xc);
      lVar13 = vpextrq_avx(auVar23,1);
      auVar24 = vextracti32x4_avx512f(auVar35,3);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],0xd);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[auVar24._0_8_],0xe);
      lVar13 = vpextrq_avx(auVar37._0_16_,1);
      auVar23 = vpinsrb_avx(ZEXT416(*(uint *)(GF256Ctx.GF256_MUL_TABLE + auVar37._0_8_)),
                            (uint)GF256Ctx.GF256_MUL_TABLE[lVar13],1);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[auVar37._16_8_],2);
      lVar13 = vpextrq_avx(auVar37._16_16_,1);
      auVar25 = vextracti32x4_avx512f(auVar37,2);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],3);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[auVar25._0_8_],4);
      lVar13 = vpextrq_avx(auVar25,1);
      auVar35 = vpsllq_avx512f(auVar28,8);
      auVar35 = vpaddq_avx512f(auVar35,auVar28);
      auVar25 = vextracti32x4_avx512f(auVar37,3);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],5);
      lVar13 = vpextrq_avx(auVar24,1);
      auVar22 = vpinsrb_avx(auVar22,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],0xf);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[auVar25._0_8_],6);
      lVar13 = vpextrq_avx(auVar25,1);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],7);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[auVar35._0_8_],8);
      lVar13 = vpextrq_avx(auVar35._0_16_,1);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],9);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[auVar35._16_8_],10);
      lVar13 = vpextrq_avx(auVar35._16_16_,1);
      auVar24 = vextracti32x4_avx512f(auVar35,2);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],0xb);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[auVar24._0_8_],0xc);
      lVar13 = vpextrq_avx(auVar24,1);
      auVar24 = vextracti32x4_avx512f(auVar35,3);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],0xd);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[auVar24._0_8_],0xe);
      lVar13 = vpextrq_avx(auVar24,1);
      auVar23 = vpinsrb_avx(auVar23,(uint)GF256Ctx.GF256_MUL_TABLE[lVar13],0xf);
      auVar41._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar23;
      auVar41._16_16_ = ZEXT116(1) * auVar22;
      auVar35 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                               ZEXT116(1) * auVar2,
                                               ZEXT116(0) * auVar2 + ZEXT116(1) * auVar21)),auVar41,
                           1);
      auVar35 = vmovdqu64_avx512f(auVar35);
      *(undefined1 (*) [64])(GF256Ctx.GF256_SQR_TABLE + lVar7) = auVar35;
      auVar33 = vpaddq_avx512f(auVar33,auVar34);
      auVar32 = vpaddq_avx512f(auVar32,auVar34);
      auVar31 = vpaddq_avx512f(auVar31,auVar34);
      lVar7 = lVar7 + 0x40;
      auVar30 = vpaddq_avx512f(auVar30,auVar34);
      auVar29 = vpaddq_avx512f(auVar29,auVar34);
      auVar28 = vpaddq_avx512f(auVar28,auVar34);
      auVar27 = vpaddq_avx512f(auVar27,auVar34);
      auVar26 = vpaddq_avx512f(auVar26,auVar34);
    } while (lVar7 != 0x100);
    lVar7 = 0x1000;
    lVar13 = 0;
    auVar26 = vpmovzxbq_avx512f(ZEXT816(0xf0e0d0c0b0a09080));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x7060504030201000));
    do {
      auVar28 = vpbroadcastq_avx512f();
      auVar29 = vporq_avx512f(auVar28,auVar27);
      lVar14 = vpextrq_avx(auVar29._0_16_,1);
      auVar2 = vpinsrb_avx(ZEXT416(*(uint *)(GF256Ctx.GF256_MUL_TABLE + lVar13)),
                           (uint)GF256Ctx.GF256_MUL_TABLE[lVar14],1);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar29._16_8_],2);
      lVar14 = vpextrq_avx(auVar29._16_16_,1);
      auVar21 = vextracti32x4_avx512f(auVar29,2);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],3);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar21._0_8_],4);
      lVar14 = vpextrq_avx(auVar21,1);
      auVar28 = vporq_avx512f(auVar28,auVar26);
      auVar21 = vextracti32x4_avx512f(auVar29,3);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],5);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar21._0_8_],6);
      lVar14 = vpextrq_avx(auVar21,1);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],7);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar28._0_8_],8);
      lVar14 = vpextrq_avx(auVar28._0_16_,1);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],9);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar28._16_8_],10);
      lVar14 = vpextrq_avx(auVar28._16_16_,1);
      auVar21 = vextracti32x4_avx512f(auVar28,2);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xb);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar21._0_8_],0xc);
      lVar14 = vpextrq_avx(auVar21,1);
      auVar21 = vextracti32x4_avx512f(auVar28,3);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xd);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[auVar21._0_8_],0xe);
      lVar14 = vpextrq_avx(auVar21,1);
      auVar2 = vpinsrb_avx(auVar2,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xf);
      uVar3 = *(undefined8 *)(GF256Ctx.GF256_MUL_TABLE + lVar13);
      uVar4 = *(undefined8 *)(GF256Ctx.GF256_MUL_TABLE + lVar13 + 8);
      m_SelfTestBuffers.A[0] = (uint8_t)uVar3;
      m_SelfTestBuffers.A[1] = (uint8_t)((ulong)uVar3 >> 8);
      m_SelfTestBuffers.A[2] = (uint8_t)((ulong)uVar3 >> 0x10);
      m_SelfTestBuffers.A[3] = (uint8_t)((ulong)uVar3 >> 0x18);
      m_SelfTestBuffers.A[4] = (uint8_t)((ulong)uVar3 >> 0x20);
      m_SelfTestBuffers.A[5] = (uint8_t)((ulong)uVar3 >> 0x28);
      m_SelfTestBuffers.A[6] = (uint8_t)((ulong)uVar3 >> 0x30);
      m_SelfTestBuffers.A[7] = (uint8_t)((ulong)uVar3 >> 0x38);
      m_SelfTestBuffers.A[8] = (uint8_t)uVar4;
      m_SelfTestBuffers.A[9] = (uint8_t)((ulong)uVar4 >> 8);
      m_SelfTestBuffers.A[10] = (uint8_t)((ulong)uVar4 >> 0x10);
      m_SelfTestBuffers.A[0xb] = (uint8_t)((ulong)uVar4 >> 0x18);
      m_SelfTestBuffers.A[0xc] = (uint8_t)((ulong)uVar4 >> 0x20);
      m_SelfTestBuffers.A[0xd] = (uint8_t)((ulong)uVar4 >> 0x28);
      m_SelfTestBuffers.A[0xe] = (uint8_t)((ulong)uVar4 >> 0x30);
      m_SelfTestBuffers.A[0xf] = (uint8_t)((ulong)uVar4 >> 0x38);
      *(undefined8 *)(Message + lVar7 + 0xea20) = uVar3;
      *(undefined8 *)(Message + lVar7 + 0xea28) = uVar4;
      *(undefined1 (*) [16])((long)GF256Ctx.MM128.TABLE_LO_Y[0] + lVar7) = auVar2;
      if ((bVar12 & 1) != 0) {
        *(undefined8 *)((long)GF256Ctx.MM128.TABLE_LO_Y[1] + lVar7 * 2) = uVar3;
        *(undefined8 *)((long)GF256Ctx.MM128.TABLE_LO_Y[1] + lVar7 * 2 + 8) = uVar4;
        *(undefined8 *)((long)GF256Ctx.MM128.TABLE_LO_Y[0] + lVar7 * 2) = uVar3;
        *(undefined8 *)((long)GF256Ctx.MM128.TABLE_LO_Y[0] + lVar7 * 2 + 8) = uVar4;
        *(undefined1 (*) [16])((long)GF256Ctx.MM256.TABLE_LO_Y[0] + lVar7 * 2 + 0x10) = auVar2;
        *(undefined1 (*) [16])((long)GF256Ctx.MM256.TABLE_LO_Y[0] + lVar7 * 2) = auVar2;
      }
      lVar7 = lVar7 + 0x10;
      lVar13 = lVar13 + 0x100;
    } while (lVar7 != 0x2000);
    m_SelfTestBuffers.B[0] = auVar2[0];
    m_SelfTestBuffers.B[1] = auVar2[1];
    m_SelfTestBuffers.B[2] = auVar2[2];
    m_SelfTestBuffers.B[3] = auVar2[3];
    m_SelfTestBuffers.B[4] = auVar2[4];
    m_SelfTestBuffers.B[5] = auVar2[5];
    m_SelfTestBuffers.B[6] = auVar2[6];
    m_SelfTestBuffers.B[7] = auVar2[7];
    m_SelfTestBuffers.B[8] = auVar2[8];
    m_SelfTestBuffers.B[9] = auVar2[9];
    m_SelfTestBuffers.B[10] = auVar2[10];
    m_SelfTestBuffers.B[0xb] = auVar2[0xb];
    m_SelfTestBuffers.B[0xc] = auVar2[0xc];
    m_SelfTestBuffers.B[0xd] = auVar2[0xd];
    m_SelfTestBuffers.B[0xe] = auVar2[0xe];
    m_SelfTestBuffers.B[0xf] = auVar2[0xf];
    lVar7 = 0x124320;
    uVar9 = 0;
    bVar20 = false;
    do {
      lVar13 = 0;
      uVar16 = 0;
      bVar19 = false;
      do {
        uVar17 = (ulong)*(byte *)(lVar7 + lVar13);
        if (lVar13 != 0 && uVar9 != 0) {
          if ((uVar16 == GF256Ctx.GF256_DIV_TABLE[uVar9 << 8 | uVar17]) &&
             (uVar9 == *(byte *)(lVar13 + uVar17 + 0x134320))) goto LAB_00102986;
LAB_001029b5:
          if (!bVar19) {
            if (!bVar20) {
              return -3;
            }
            goto LAB_001029ee;
          }
          break;
        }
        if (uVar17 != 0) goto LAB_001029b5;
LAB_00102986:
        if ((lVar13 == 0x100) && (uVar9 != uVar17)) goto LAB_001029b5;
        bVar19 = 0xfe < uVar16;
        uVar16 = uVar16 + 1;
        lVar13 = lVar13 + 0x100;
      } while (lVar13 != 0x10000);
      bVar20 = 0xfe < uVar9;
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 1;
    } while (uVar9 != 0x100);
LAB_001029ee:
    builtin_memcpy(m_SelfTestBuffers.A,
                   "\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1fZ"
                   ,0x40);
    m_SelfTestBuffers.B[0x3f] = 'Z';
    m_SelfTestBuffers.C[0x3f] = 'Z';
    m_SelfTestBuffers.B[0] = 0xf7;
    m_SelfTestBuffers.B[1] = 0xf7;
    m_SelfTestBuffers.B[2] = 0xf7;
    m_SelfTestBuffers.B[3] = 0xf7;
    m_SelfTestBuffers.B[4] = 0xf7;
    m_SelfTestBuffers.B[5] = 0xf7;
    m_SelfTestBuffers.B[6] = 0xf7;
    m_SelfTestBuffers.B[7] = 0xf7;
    m_SelfTestBuffers.B[8] = 0xf7;
    m_SelfTestBuffers.B[9] = 0xf7;
    m_SelfTestBuffers.B[10] = 0xf7;
    m_SelfTestBuffers.B[0xb] = 0xf7;
    m_SelfTestBuffers.B[0xc] = 0xf7;
    m_SelfTestBuffers.B[0xd] = 0xf7;
    m_SelfTestBuffers.B[0xe] = 0xf7;
    m_SelfTestBuffers.B[0xf] = 0xf7;
    m_SelfTestBuffers.B[0x10] = 0xf7;
    m_SelfTestBuffers.B[0x11] = 0xf7;
    m_SelfTestBuffers.B[0x12] = 0xf7;
    m_SelfTestBuffers.B[0x13] = 0xf7;
    m_SelfTestBuffers.B[0x14] = 0xf7;
    m_SelfTestBuffers.B[0x15] = 0xf7;
    m_SelfTestBuffers.B[0x16] = 0xf7;
    m_SelfTestBuffers.B[0x17] = 0xf7;
    m_SelfTestBuffers.B[0x18] = 0xf7;
    m_SelfTestBuffers.B[0x19] = 0xf7;
    m_SelfTestBuffers.B[0x1a] = 0xf7;
    m_SelfTestBuffers.B[0x1b] = 0xf7;
    m_SelfTestBuffers.B[0x1c] = 0xf7;
    m_SelfTestBuffers.B[0x1d] = 0xf7;
    m_SelfTestBuffers.B[0x1e] = 0xf7;
    m_SelfTestBuffers.B[0x1f] = 0xf7;
    m_SelfTestBuffers.B[0x20] = 0xf7;
    m_SelfTestBuffers.B[0x21] = 0xf7;
    m_SelfTestBuffers.B[0x22] = 0xf7;
    m_SelfTestBuffers.B[0x23] = 0xf7;
    m_SelfTestBuffers.B[0x24] = 0xf7;
    m_SelfTestBuffers.B[0x25] = 0xf7;
    m_SelfTestBuffers.B[0x26] = 0xf7;
    m_SelfTestBuffers.B[0x27] = 0xf7;
    m_SelfTestBuffers.B[0x28] = 0xf7;
    m_SelfTestBuffers.B[0x29] = 0xf7;
    m_SelfTestBuffers.B[0x2a] = 0xf7;
    m_SelfTestBuffers.B[0x2b] = 0xf7;
    m_SelfTestBuffers.B[0x2c] = 0xf7;
    m_SelfTestBuffers.B[0x2d] = 0xf7;
    m_SelfTestBuffers.B[0x2e] = 0xf7;
    m_SelfTestBuffers.B[0x2f] = 0xf7;
    m_SelfTestBuffers.B[0x30] = 0xf7;
    m_SelfTestBuffers.B[0x31] = 0xf7;
    m_SelfTestBuffers.B[0x32] = 0xf7;
    m_SelfTestBuffers.B[0x33] = 0xf7;
    m_SelfTestBuffers.B[0x34] = 0xf7;
    m_SelfTestBuffers.B[0x35] = 0xf7;
    m_SelfTestBuffers.B[0x36] = 0xf7;
    m_SelfTestBuffers.B[0x37] = 0xf7;
    m_SelfTestBuffers.B[0x38] = 0xf7;
    m_SelfTestBuffers.B[0x39] = 0xf7;
    m_SelfTestBuffers.B[0x3a] = 0xf7;
    m_SelfTestBuffers.B[0x3b] = 0xf7;
    m_SelfTestBuffers.B[0x3c] = 0xf7;
    m_SelfTestBuffers.B[0x3d] = 0xf7;
    m_SelfTestBuffers.B[0x3e] = 0xf7;
    gf256_add_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,0x3f);
    iVar11 = -3;
    if (m_SelfTestBuffers.A[0] == 0xe8) {
      uVar9 = 0xffffffffffffffff;
      do {
        if (uVar9 == 0x3d) goto LAB_00102a8a;
        uVar16 = uVar9 + 1;
        lVar7 = uVar9 + 2;
        uVar9 = uVar16;
      } while (m_SelfTestBuffers.A[lVar7] == 0xe8);
      if (0x3d < uVar16) {
LAB_00102a8a:
        builtin_memcpy(m_SelfTestBuffers.A,
                       "\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f"
                       ,0x3f);
        m_SelfTestBuffers.B[0] = 0xf7;
        m_SelfTestBuffers.B[1] = 0xf7;
        m_SelfTestBuffers.B[2] = 0xf7;
        m_SelfTestBuffers.B[3] = 0xf7;
        m_SelfTestBuffers.B[4] = 0xf7;
        m_SelfTestBuffers.B[5] = 0xf7;
        m_SelfTestBuffers.B[6] = 0xf7;
        m_SelfTestBuffers.B[7] = 0xf7;
        m_SelfTestBuffers.B[8] = 0xf7;
        m_SelfTestBuffers.B[9] = 0xf7;
        m_SelfTestBuffers.B[10] = 0xf7;
        m_SelfTestBuffers.B[0xb] = 0xf7;
        m_SelfTestBuffers.B[0xc] = 0xf7;
        m_SelfTestBuffers.B[0xd] = 0xf7;
        m_SelfTestBuffers.B[0xe] = 0xf7;
        m_SelfTestBuffers.B[0xf] = 0xf7;
        m_SelfTestBuffers.B[0x10] = 0xf7;
        m_SelfTestBuffers.B[0x11] = 0xf7;
        m_SelfTestBuffers.B[0x12] = 0xf7;
        m_SelfTestBuffers.B[0x13] = 0xf7;
        m_SelfTestBuffers.B[0x14] = 0xf7;
        m_SelfTestBuffers.B[0x15] = 0xf7;
        m_SelfTestBuffers.B[0x16] = 0xf7;
        m_SelfTestBuffers.B[0x17] = 0xf7;
        m_SelfTestBuffers.B[0x18] = 0xf7;
        m_SelfTestBuffers.B[0x19] = 0xf7;
        m_SelfTestBuffers.B[0x1a] = 0xf7;
        m_SelfTestBuffers.B[0x1b] = 0xf7;
        m_SelfTestBuffers.B[0x1c] = 0xf7;
        m_SelfTestBuffers.B[0x1d] = 0xf7;
        m_SelfTestBuffers.B[0x1e] = 0xf7;
        m_SelfTestBuffers.B[0x1f] = 0xf7;
        m_SelfTestBuffers.B[0x20] = 0xf7;
        m_SelfTestBuffers.B[0x21] = 0xf7;
        m_SelfTestBuffers.B[0x22] = 0xf7;
        m_SelfTestBuffers.B[0x23] = 0xf7;
        m_SelfTestBuffers.B[0x24] = 0xf7;
        m_SelfTestBuffers.B[0x25] = 0xf7;
        m_SelfTestBuffers.B[0x26] = 0xf7;
        m_SelfTestBuffers.B[0x27] = 0xf7;
        m_SelfTestBuffers.B[0x28] = 0xf7;
        m_SelfTestBuffers.B[0x29] = 0xf7;
        m_SelfTestBuffers.B[0x2a] = 0xf7;
        m_SelfTestBuffers.B[0x2b] = 0xf7;
        m_SelfTestBuffers.B[0x2c] = 0xf7;
        m_SelfTestBuffers.B[0x2d] = 0xf7;
        m_SelfTestBuffers.B[0x2e] = 0xf7;
        m_SelfTestBuffers.B[0x2f] = 0xf7;
        m_SelfTestBuffers.B[0x30] = 0xf7;
        m_SelfTestBuffers.B[0x31] = 0xf7;
        m_SelfTestBuffers.B[0x32] = 0xf7;
        m_SelfTestBuffers.B[0x33] = 0xf7;
        m_SelfTestBuffers.B[0x34] = 0xf7;
        m_SelfTestBuffers.B[0x35] = 0xf7;
        m_SelfTestBuffers.B[0x36] = 0xf7;
        m_SelfTestBuffers.B[0x37] = 0xf7;
        m_SelfTestBuffers.B[0x38] = 0xf7;
        m_SelfTestBuffers.B[0x39] = 0xf7;
        m_SelfTestBuffers.B[0x3a] = 0xf7;
        m_SelfTestBuffers.B[0x3b] = 0xf7;
        m_SelfTestBuffers.B[0x3c] = 0xf7;
        m_SelfTestBuffers.B[0x3d] = 0xf7;
        m_SelfTestBuffers.B[0x3e] = 0xf7;
        builtin_memcpy(m_SelfTestBuffers.C,
                       "qqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqq",0x3f);
        gf256_add2_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,m_SelfTestBuffers.C,0x3f);
        if (m_SelfTestBuffers.A[0] == 0x99) {
          uVar9 = 0xffffffffffffffff;
          do {
            if (uVar9 == 0x3d) goto LAB_00102b2d;
            uVar16 = uVar9 + 1;
            lVar7 = uVar9 + 2;
            uVar9 = uVar16;
          } while (m_SelfTestBuffers.A[lVar7] == 0x99);
          if (0x3d < uVar16) {
LAB_00102b2d:
            builtin_memcpy(m_SelfTestBuffers.A,
                           "UUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUU",0x3f);
            m_SelfTestBuffers.B[0] = 0xaa;
            m_SelfTestBuffers.B[1] = 0xaa;
            m_SelfTestBuffers.B[2] = 0xaa;
            m_SelfTestBuffers.B[3] = 0xaa;
            m_SelfTestBuffers.B[4] = 0xaa;
            m_SelfTestBuffers.B[5] = 0xaa;
            m_SelfTestBuffers.B[6] = 0xaa;
            m_SelfTestBuffers.B[7] = 0xaa;
            m_SelfTestBuffers.B[8] = 0xaa;
            m_SelfTestBuffers.B[9] = 0xaa;
            m_SelfTestBuffers.B[10] = 0xaa;
            m_SelfTestBuffers.B[0xb] = 0xaa;
            m_SelfTestBuffers.B[0xc] = 0xaa;
            m_SelfTestBuffers.B[0xd] = 0xaa;
            m_SelfTestBuffers.B[0xe] = 0xaa;
            m_SelfTestBuffers.B[0xf] = 0xaa;
            m_SelfTestBuffers.B[0x10] = 0xaa;
            m_SelfTestBuffers.B[0x11] = 0xaa;
            m_SelfTestBuffers.B[0x12] = 0xaa;
            m_SelfTestBuffers.B[0x13] = 0xaa;
            m_SelfTestBuffers.B[0x14] = 0xaa;
            m_SelfTestBuffers.B[0x15] = 0xaa;
            m_SelfTestBuffers.B[0x16] = 0xaa;
            m_SelfTestBuffers.B[0x17] = 0xaa;
            m_SelfTestBuffers.B[0x18] = 0xaa;
            m_SelfTestBuffers.B[0x19] = 0xaa;
            m_SelfTestBuffers.B[0x1a] = 0xaa;
            m_SelfTestBuffers.B[0x1b] = 0xaa;
            m_SelfTestBuffers.B[0x1c] = 0xaa;
            m_SelfTestBuffers.B[0x1d] = 0xaa;
            m_SelfTestBuffers.B[0x1e] = 0xaa;
            m_SelfTestBuffers.B[0x1f] = 0xaa;
            m_SelfTestBuffers.B[0x20] = 0xaa;
            m_SelfTestBuffers.B[0x21] = 0xaa;
            m_SelfTestBuffers.B[0x22] = 0xaa;
            m_SelfTestBuffers.B[0x23] = 0xaa;
            m_SelfTestBuffers.B[0x24] = 0xaa;
            m_SelfTestBuffers.B[0x25] = 0xaa;
            m_SelfTestBuffers.B[0x26] = 0xaa;
            m_SelfTestBuffers.B[0x27] = 0xaa;
            m_SelfTestBuffers.B[0x28] = 0xaa;
            m_SelfTestBuffers.B[0x29] = 0xaa;
            m_SelfTestBuffers.B[0x2a] = 0xaa;
            m_SelfTestBuffers.B[0x2b] = 0xaa;
            m_SelfTestBuffers.B[0x2c] = 0xaa;
            m_SelfTestBuffers.B[0x2d] = 0xaa;
            m_SelfTestBuffers.B[0x2e] = 0xaa;
            m_SelfTestBuffers.B[0x2f] = 0xaa;
            m_SelfTestBuffers.B[0x30] = 0xaa;
            m_SelfTestBuffers.B[0x31] = 0xaa;
            m_SelfTestBuffers.B[0x32] = 0xaa;
            m_SelfTestBuffers.B[0x33] = 0xaa;
            m_SelfTestBuffers.B[0x34] = 0xaa;
            m_SelfTestBuffers.B[0x35] = 0xaa;
            m_SelfTestBuffers.B[0x36] = 0xaa;
            m_SelfTestBuffers.B[0x37] = 0xaa;
            m_SelfTestBuffers.B[0x38] = 0xaa;
            m_SelfTestBuffers.B[0x39] = 0xaa;
            m_SelfTestBuffers.B[0x3a] = 0xaa;
            m_SelfTestBuffers.B[0x3b] = 0xaa;
            m_SelfTestBuffers.B[0x3c] = 0xaa;
            m_SelfTestBuffers.B[0x3d] = 0xaa;
            m_SelfTestBuffers.B[0x3e] = 0xaa;
            builtin_memcpy(m_SelfTestBuffers.C,"lllllllllllllllllllllllllllllll",0x1f);
            m_SelfTestBuffers.C[0x3e] = 'l';
            auVar41 = ZEXT1632(CONCAT115(0x6c,CONCAT114(0x6c,CONCAT113(0x6c,CONCAT112(0x6c,CONCAT111
                                                  (0x6c,CONCAT110(0x6c,CONCAT19(0x6c,CONCAT18(0x6c,
                                                  0x6c6c6c6c6c6c6c6c)))))))));
            m_SelfTestBuffers.C[0x1f] = m_SelfTestBuffers.C[0];
            m_SelfTestBuffers.C[0x20] = m_SelfTestBuffers.C[1];
            m_SelfTestBuffers.C[0x21] = m_SelfTestBuffers.C[2];
            m_SelfTestBuffers.C[0x22] = m_SelfTestBuffers.C[3];
            m_SelfTestBuffers.C[0x23] = m_SelfTestBuffers.C[4];
            m_SelfTestBuffers.C[0x24] = m_SelfTestBuffers.C[5];
            m_SelfTestBuffers.C[0x25] = m_SelfTestBuffers.C[6];
            m_SelfTestBuffers.C[0x26] = m_SelfTestBuffers.C[7];
            m_SelfTestBuffers.C[0x27] = m_SelfTestBuffers.C[8];
            m_SelfTestBuffers.C[0x28] = m_SelfTestBuffers.C[9];
            m_SelfTestBuffers.C[0x29] = m_SelfTestBuffers.C[10];
            m_SelfTestBuffers.C[0x2a] = m_SelfTestBuffers.C[0xb];
            m_SelfTestBuffers.C[0x2b] = m_SelfTestBuffers.C[0xc];
            m_SelfTestBuffers.C[0x2c] = m_SelfTestBuffers.C[0xd];
            m_SelfTestBuffers.C[0x2d] = m_SelfTestBuffers.C[0xe];
            m_SelfTestBuffers.C[0x2e] = m_SelfTestBuffers.C[0xf];
            m_SelfTestBuffers.C[0x2f] = m_SelfTestBuffers.C[0x10];
            m_SelfTestBuffers.C[0x30] = m_SelfTestBuffers.C[0x11];
            m_SelfTestBuffers.C[0x31] = m_SelfTestBuffers.C[0x12];
            m_SelfTestBuffers.C[0x32] = m_SelfTestBuffers.C[0x13];
            m_SelfTestBuffers.C[0x33] = m_SelfTestBuffers.C[0x14];
            m_SelfTestBuffers.C[0x34] = m_SelfTestBuffers.C[0x15];
            m_SelfTestBuffers.C[0x35] = m_SelfTestBuffers.C[0x16];
            m_SelfTestBuffers.C[0x36] = m_SelfTestBuffers.C[0x17];
            m_SelfTestBuffers.C[0x37] = m_SelfTestBuffers.C[0x18];
            m_SelfTestBuffers.C[0x38] = m_SelfTestBuffers.C[0x19];
            m_SelfTestBuffers.C[0x39] = m_SelfTestBuffers.C[0x1a];
            m_SelfTestBuffers.C[0x3a] = m_SelfTestBuffers.C[0x1b];
            m_SelfTestBuffers.C[0x3b] = m_SelfTestBuffers.C[0x1c];
            m_SelfTestBuffers.C[0x3c] = m_SelfTestBuffers.C[0x1d];
            m_SelfTestBuffers.C[0x3d] = m_SelfTestBuffers.C[0x1e];
            gf256_addset_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,m_SelfTestBuffers.C,0x3f);
            uVar6 = GF256Ctx.GF256_MUL_TABLE[0x6caa];
            if (m_SelfTestBuffers.A[0] == 0xc6) {
              uVar9 = 0xffffffffffffffff;
              do {
                if (uVar9 == 0x3d) goto LAB_00102bd0;
                uVar16 = uVar9 + 1;
                lVar7 = uVar9 + 2;
                uVar9 = uVar16;
              } while (m_SelfTestBuffers.A[lVar7] == 0xc6);
              if (0x3d < uVar16) {
LAB_00102bd0:
                auVar41 = vpcmpeqd_avx2(auVar41,auVar41);
                m_SelfTestBuffers.A[0x20] = auVar41[1];
                m_SelfTestBuffers.A[0x21] = auVar41[2];
                m_SelfTestBuffers.A[0x22] = auVar41[3];
                m_SelfTestBuffers.A[0x23] = auVar41[4];
                m_SelfTestBuffers.A[0x24] = auVar41[5];
                m_SelfTestBuffers.A[0x25] = auVar41[6];
                m_SelfTestBuffers.A[0x26] = auVar41[7];
                m_SelfTestBuffers.A[0x27] = auVar41[8];
                m_SelfTestBuffers.A[0x28] = auVar41[9];
                m_SelfTestBuffers.A[0x29] = auVar41[10];
                m_SelfTestBuffers.A[0x2a] = auVar41[0xb];
                m_SelfTestBuffers.A[0x2b] = auVar41[0xc];
                m_SelfTestBuffers.A[0x2c] = auVar41[0xd];
                m_SelfTestBuffers.A[0x2d] = auVar41[0xe];
                m_SelfTestBuffers.A[0x2e] = auVar41[0xf];
                m_SelfTestBuffers.A[0x2f] = auVar41[0x10];
                m_SelfTestBuffers.A[0x30] = auVar41[0x11];
                m_SelfTestBuffers.A[0x31] = auVar41[0x12];
                m_SelfTestBuffers.A[0x32] = auVar41[0x13];
                m_SelfTestBuffers.A[0x33] = auVar41[0x14];
                m_SelfTestBuffers.A[0x34] = auVar41[0x15];
                m_SelfTestBuffers.A[0x35] = auVar41[0x16];
                m_SelfTestBuffers.A[0x36] = auVar41[0x17];
                m_SelfTestBuffers.A[0x37] = auVar41[0x18];
                m_SelfTestBuffers.A[0x38] = auVar41[0x19];
                m_SelfTestBuffers.A[0x39] = auVar41[0x1a];
                m_SelfTestBuffers.A[0x3a] = auVar41[0x1b];
                m_SelfTestBuffers.A[0x3b] = auVar41[0x1c];
                m_SelfTestBuffers.A[0x3c] = auVar41[0x1d];
                m_SelfTestBuffers.A[0x3d] = auVar41[0x1e];
                m_SelfTestBuffers.A[0x3e] = auVar41[0x1f];
                m_SelfTestBuffers.A[0] = auVar41[0];
                m_SelfTestBuffers.B[0] = 0xaa;
                m_SelfTestBuffers.B[1] = 0xaa;
                m_SelfTestBuffers.B[2] = 0xaa;
                m_SelfTestBuffers.B[3] = 0xaa;
                m_SelfTestBuffers.B[4] = 0xaa;
                m_SelfTestBuffers.B[5] = 0xaa;
                m_SelfTestBuffers.B[6] = 0xaa;
                m_SelfTestBuffers.B[7] = 0xaa;
                m_SelfTestBuffers.B[8] = 0xaa;
                m_SelfTestBuffers.B[9] = 0xaa;
                m_SelfTestBuffers.B[10] = 0xaa;
                m_SelfTestBuffers.B[0xb] = 0xaa;
                m_SelfTestBuffers.B[0xc] = 0xaa;
                m_SelfTestBuffers.B[0xd] = 0xaa;
                m_SelfTestBuffers.B[0xe] = 0xaa;
                m_SelfTestBuffers.B[0xf] = 0xaa;
                m_SelfTestBuffers.B[0x10] = 0xaa;
                m_SelfTestBuffers.B[0x11] = 0xaa;
                m_SelfTestBuffers.B[0x12] = 0xaa;
                m_SelfTestBuffers.B[0x13] = 0xaa;
                m_SelfTestBuffers.B[0x14] = 0xaa;
                m_SelfTestBuffers.B[0x15] = 0xaa;
                m_SelfTestBuffers.B[0x16] = 0xaa;
                m_SelfTestBuffers.B[0x17] = 0xaa;
                m_SelfTestBuffers.B[0x18] = 0xaa;
                m_SelfTestBuffers.B[0x19] = 0xaa;
                m_SelfTestBuffers.B[0x1a] = 0xaa;
                m_SelfTestBuffers.B[0x1b] = 0xaa;
                m_SelfTestBuffers.B[0x1c] = 0xaa;
                m_SelfTestBuffers.B[0x1d] = 0xaa;
                m_SelfTestBuffers.B[0x1e] = 0xaa;
                m_SelfTestBuffers.B[0x3e] = 0xaa;
                auVar41 = ZEXT1632(CONCAT115(0xaa,CONCAT114(0xaa,CONCAT113(0xaa,CONCAT112(0xaa,
                                                  CONCAT111(0xaa,CONCAT110(0xaa,CONCAT19(0xaa,
                                                  CONCAT18(0xaa,0xaaaaaaaaaaaaaaaa)))))))));
                m_SelfTestBuffers.A[1] = m_SelfTestBuffers.A[0x20];
                m_SelfTestBuffers.A[2] = m_SelfTestBuffers.A[0x21];
                m_SelfTestBuffers.A[3] = m_SelfTestBuffers.A[0x22];
                m_SelfTestBuffers.A[4] = m_SelfTestBuffers.A[0x23];
                m_SelfTestBuffers.A[5] = m_SelfTestBuffers.A[0x24];
                m_SelfTestBuffers.A[6] = m_SelfTestBuffers.A[0x25];
                m_SelfTestBuffers.A[7] = m_SelfTestBuffers.A[0x26];
                m_SelfTestBuffers.A[8] = m_SelfTestBuffers.A[0x27];
                m_SelfTestBuffers.A[9] = m_SelfTestBuffers.A[0x28];
                m_SelfTestBuffers.A[10] = m_SelfTestBuffers.A[0x29];
                m_SelfTestBuffers.A[0xb] = m_SelfTestBuffers.A[0x2a];
                m_SelfTestBuffers.A[0xc] = m_SelfTestBuffers.A[0x2b];
                m_SelfTestBuffers.A[0xd] = m_SelfTestBuffers.A[0x2c];
                m_SelfTestBuffers.A[0xe] = m_SelfTestBuffers.A[0x2d];
                m_SelfTestBuffers.A[0xf] = m_SelfTestBuffers.A[0x2e];
                m_SelfTestBuffers.A[0x10] = m_SelfTestBuffers.A[0x2f];
                m_SelfTestBuffers.A[0x11] = m_SelfTestBuffers.A[0x30];
                m_SelfTestBuffers.A[0x12] = m_SelfTestBuffers.A[0x31];
                m_SelfTestBuffers.A[0x13] = m_SelfTestBuffers.A[0x32];
                m_SelfTestBuffers.A[0x14] = m_SelfTestBuffers.A[0x33];
                m_SelfTestBuffers.A[0x15] = m_SelfTestBuffers.A[0x34];
                m_SelfTestBuffers.A[0x16] = m_SelfTestBuffers.A[0x35];
                m_SelfTestBuffers.A[0x17] = m_SelfTestBuffers.A[0x36];
                m_SelfTestBuffers.A[0x18] = m_SelfTestBuffers.A[0x37];
                m_SelfTestBuffers.A[0x19] = m_SelfTestBuffers.A[0x38];
                m_SelfTestBuffers.A[0x1a] = m_SelfTestBuffers.A[0x39];
                m_SelfTestBuffers.A[0x1b] = m_SelfTestBuffers.A[0x3a];
                m_SelfTestBuffers.A[0x1c] = m_SelfTestBuffers.A[0x3b];
                m_SelfTestBuffers.A[0x1d] = m_SelfTestBuffers.A[0x3c];
                m_SelfTestBuffers.A[0x1e] = m_SelfTestBuffers.A[0x3d];
                m_SelfTestBuffers.A[0x1f] = m_SelfTestBuffers.A[0x3e];
                m_SelfTestBuffers.B[0x1f] = m_SelfTestBuffers.B[0];
                m_SelfTestBuffers.B[0x20] = m_SelfTestBuffers.B[1];
                m_SelfTestBuffers.B[0x21] = m_SelfTestBuffers.B[2];
                m_SelfTestBuffers.B[0x22] = m_SelfTestBuffers.B[3];
                m_SelfTestBuffers.B[0x23] = m_SelfTestBuffers.B[4];
                m_SelfTestBuffers.B[0x24] = m_SelfTestBuffers.B[5];
                m_SelfTestBuffers.B[0x25] = m_SelfTestBuffers.B[6];
                m_SelfTestBuffers.B[0x26] = m_SelfTestBuffers.B[7];
                m_SelfTestBuffers.B[0x27] = m_SelfTestBuffers.B[8];
                m_SelfTestBuffers.B[0x28] = m_SelfTestBuffers.B[9];
                m_SelfTestBuffers.B[0x29] = m_SelfTestBuffers.B[10];
                m_SelfTestBuffers.B[0x2a] = m_SelfTestBuffers.B[0xb];
                m_SelfTestBuffers.B[0x2b] = m_SelfTestBuffers.B[0xc];
                m_SelfTestBuffers.B[0x2c] = m_SelfTestBuffers.B[0xd];
                m_SelfTestBuffers.B[0x2d] = m_SelfTestBuffers.B[0xe];
                m_SelfTestBuffers.B[0x2e] = m_SelfTestBuffers.B[0xf];
                m_SelfTestBuffers.B[0x2f] = m_SelfTestBuffers.B[0x10];
                m_SelfTestBuffers.B[0x30] = m_SelfTestBuffers.B[0x11];
                m_SelfTestBuffers.B[0x31] = m_SelfTestBuffers.B[0x12];
                m_SelfTestBuffers.B[0x32] = m_SelfTestBuffers.B[0x13];
                m_SelfTestBuffers.B[0x33] = m_SelfTestBuffers.B[0x14];
                m_SelfTestBuffers.B[0x34] = m_SelfTestBuffers.B[0x15];
                m_SelfTestBuffers.B[0x35] = m_SelfTestBuffers.B[0x16];
                m_SelfTestBuffers.B[0x36] = m_SelfTestBuffers.B[0x17];
                m_SelfTestBuffers.B[0x37] = m_SelfTestBuffers.B[0x18];
                m_SelfTestBuffers.B[0x38] = m_SelfTestBuffers.B[0x19];
                m_SelfTestBuffers.B[0x39] = m_SelfTestBuffers.B[0x1a];
                m_SelfTestBuffers.B[0x3a] = m_SelfTestBuffers.B[0x1b];
                m_SelfTestBuffers.B[0x3b] = m_SelfTestBuffers.B[0x1c];
                m_SelfTestBuffers.B[0x3c] = m_SelfTestBuffers.B[0x1d];
                m_SelfTestBuffers.B[0x3d] = m_SelfTestBuffers.B[0x1e];
                gf256_muladd_mem(&m_SelfTestBuffers,'l',m_SelfTestBuffers.B,0x3f);
                uVar5 = GF256Ctx.GF256_MUL_TABLE[0x55a2];
                lVar7 = 0;
                do {
                  if ((m_SelfTestBuffers.A[lVar7] ^ uVar6) != 0xff) {
                    return -3;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 0x3f);
                auVar41 = vpcmpeqd_avx2(auVar41,auVar41);
                m_SelfTestBuffers.A[0x20] = auVar41[1];
                m_SelfTestBuffers.A[0x21] = auVar41[2];
                m_SelfTestBuffers.A[0x22] = auVar41[3];
                m_SelfTestBuffers.A[0x23] = auVar41[4];
                m_SelfTestBuffers.A[0x24] = auVar41[5];
                m_SelfTestBuffers.A[0x25] = auVar41[6];
                m_SelfTestBuffers.A[0x26] = auVar41[7];
                m_SelfTestBuffers.A[0x27] = auVar41[8];
                m_SelfTestBuffers.A[0x28] = auVar41[9];
                m_SelfTestBuffers.A[0x29] = auVar41[10];
                m_SelfTestBuffers.A[0x2a] = auVar41[0xb];
                m_SelfTestBuffers.A[0x2b] = auVar41[0xc];
                m_SelfTestBuffers.A[0x2c] = auVar41[0xd];
                m_SelfTestBuffers.A[0x2d] = auVar41[0xe];
                m_SelfTestBuffers.A[0x2e] = auVar41[0xf];
                m_SelfTestBuffers.A[0x2f] = auVar41[0x10];
                m_SelfTestBuffers.A[0x30] = auVar41[0x11];
                m_SelfTestBuffers.A[0x31] = auVar41[0x12];
                m_SelfTestBuffers.A[0x32] = auVar41[0x13];
                m_SelfTestBuffers.A[0x33] = auVar41[0x14];
                m_SelfTestBuffers.A[0x34] = auVar41[0x15];
                m_SelfTestBuffers.A[0x35] = auVar41[0x16];
                m_SelfTestBuffers.A[0x36] = auVar41[0x17];
                m_SelfTestBuffers.A[0x37] = auVar41[0x18];
                m_SelfTestBuffers.A[0x38] = auVar41[0x19];
                m_SelfTestBuffers.A[0x39] = auVar41[0x1a];
                m_SelfTestBuffers.A[0x3a] = auVar41[0x1b];
                m_SelfTestBuffers.A[0x3b] = auVar41[0x1c];
                m_SelfTestBuffers.A[0x3c] = auVar41[0x1d];
                m_SelfTestBuffers.A[0x3d] = auVar41[0x1e];
                m_SelfTestBuffers.A[0x3e] = auVar41[0x1f];
                m_SelfTestBuffers.A[0] = auVar41[0];
                builtin_memcpy(m_SelfTestBuffers.B,
                               "UUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUU",
                               0x3f);
                m_SelfTestBuffers.A[1] = m_SelfTestBuffers.A[0x20];
                m_SelfTestBuffers.A[2] = m_SelfTestBuffers.A[0x21];
                m_SelfTestBuffers.A[3] = m_SelfTestBuffers.A[0x22];
                m_SelfTestBuffers.A[4] = m_SelfTestBuffers.A[0x23];
                m_SelfTestBuffers.A[5] = m_SelfTestBuffers.A[0x24];
                m_SelfTestBuffers.A[6] = m_SelfTestBuffers.A[0x25];
                m_SelfTestBuffers.A[7] = m_SelfTestBuffers.A[0x26];
                m_SelfTestBuffers.A[8] = m_SelfTestBuffers.A[0x27];
                m_SelfTestBuffers.A[9] = m_SelfTestBuffers.A[0x28];
                m_SelfTestBuffers.A[10] = m_SelfTestBuffers.A[0x29];
                m_SelfTestBuffers.A[0xb] = m_SelfTestBuffers.A[0x2a];
                m_SelfTestBuffers.A[0xc] = m_SelfTestBuffers.A[0x2b];
                m_SelfTestBuffers.A[0xd] = m_SelfTestBuffers.A[0x2c];
                m_SelfTestBuffers.A[0xe] = m_SelfTestBuffers.A[0x2d];
                m_SelfTestBuffers.A[0xf] = m_SelfTestBuffers.A[0x2e];
                m_SelfTestBuffers.A[0x10] = m_SelfTestBuffers.A[0x2f];
                m_SelfTestBuffers.A[0x11] = m_SelfTestBuffers.A[0x30];
                m_SelfTestBuffers.A[0x12] = m_SelfTestBuffers.A[0x31];
                m_SelfTestBuffers.A[0x13] = m_SelfTestBuffers.A[0x32];
                m_SelfTestBuffers.A[0x14] = m_SelfTestBuffers.A[0x33];
                m_SelfTestBuffers.A[0x15] = m_SelfTestBuffers.A[0x34];
                m_SelfTestBuffers.A[0x16] = m_SelfTestBuffers.A[0x35];
                m_SelfTestBuffers.A[0x17] = m_SelfTestBuffers.A[0x36];
                m_SelfTestBuffers.A[0x18] = m_SelfTestBuffers.A[0x37];
                m_SelfTestBuffers.A[0x19] = m_SelfTestBuffers.A[0x38];
                m_SelfTestBuffers.A[0x1a] = m_SelfTestBuffers.A[0x39];
                m_SelfTestBuffers.A[0x1b] = m_SelfTestBuffers.A[0x3a];
                m_SelfTestBuffers.A[0x1c] = m_SelfTestBuffers.A[0x3b];
                m_SelfTestBuffers.A[0x1d] = m_SelfTestBuffers.A[0x3c];
                m_SelfTestBuffers.A[0x1e] = m_SelfTestBuffers.A[0x3d];
                m_SelfTestBuffers.A[0x1f] = m_SelfTestBuffers.A[0x3e];
                gf256_mul_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,0xa2,0x3f);
                lVar7 = 0;
                do {
                  if (m_SelfTestBuffers.A[lVar7] != uVar5) {
                    return -3;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 0x3f);
                if ((m_SelfTestBuffers.A[0x3f] == 'Z') && (m_SelfTestBuffers.B[0x3f] == 'Z')) {
                  iVar11 = (uint)(m_SelfTestBuffers.C[0x3f] == 'Z') * 3 + -3;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar11;
}

Assistant:

int gf256_init_(int version)
{
    if (version != GF256_VERSION)
        return -1; // User's header does not match library version.

    // Avoid multiple initialization
    if (Initialized)
        return 0;
    Initialized = true;

    if (!IsExpectedEndian())
        return -2; // Unexpected byte order.

    gf256_architecture_init();
    gf256_poly_init(kDefaultPolynomialIndex);
    gf256_explog_init();
    gf256_muldiv_init();
    gf256_inv_init();
    gf256_sqr_init();
    gf256_mul_mem_init();

    if (!gf256_self_test())
        return -3; // Self-test failed (perhaps untested configuration)

    return 0;
}